

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.h
# Opt level: O0

void __thiscall flow::PassManager::logDebug<int>(PassManager *this,char *msg,int args)

{
  string_view local_50;
  string local_40;
  int local_1c;
  char *pcStack_18;
  int args_local;
  char *msg_local;
  PassManager *this_local;
  
  local_1c = args;
  pcStack_18 = msg;
  msg_local = (char *)this;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_50,msg);
  fmt::v5::format<int>(&local_40,local_50,&local_1c);
  logDebug(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void logDebug(const char* msg, Args... args) {
    logDebug(fmt::format(msg, args...));
  }